

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O0

void __thiscall MemMap::MemMap(MemMap *this,MemMap *other)

{
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *in_RDI = *in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)(in_RSI + 2));
  *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(in_RSI + 0xc);
  *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RSI + 10);
  *(undefined8 *)(in_RSI + 10) = 0;
  *in_RSI = 0xffffffff;
  return;
}

Assistant:

MemMap::MemMap(MemMap &&other) {
    this->fd = other.fd;
    this->fname = other.fname;
    this->fsize = other.fsize;
    this->mmap_ptr = other.mmap_ptr;

    other.mmap_ptr = nullptr;
    other.fd = -1;
}